

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O1

void Hacl_Bignum256_32_sqr(uint32_t *a,uint32_t *res)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t i;
  long lVar7;
  uint32_t i_1;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  uint auStack_54 [3];
  uint32_t tmp [16];
  
  res[0xc] = 0;
  res[0xd] = 0;
  res[0xe] = 0;
  res[0xf] = 0;
  res[8] = 0;
  res[9] = 0;
  res[10] = 0;
  res[0xb] = 0;
  res[4] = 0;
  res[5] = 0;
  res[6] = 0;
  res[7] = 0;
  res[0] = 0;
  res[1] = 0;
  res[2] = 0;
  res[3] = 0;
  *(ulong *)(res + 1) = (ulong)res[1] + (ulong)*a * (ulong)a[1];
  uVar2 = a[2];
  lVar7 = 0;
  uVar8 = 0;
  do {
    uVar10 = res[lVar7 + 2] + uVar8 + (ulong)a[lVar7] * (ulong)uVar2;
    res[lVar7 + 2] = (uint32_t)uVar10;
    uVar8 = uVar10 >> 0x20;
    lVar7 = lVar7 + 1;
  } while (lVar7 == 1);
  res[4] = (uint32_t)(uVar10 >> 0x20);
  uVar2 = a[3];
  lVar7 = 0;
  uVar8 = 0;
  do {
    uVar10 = res[lVar7 + 3] + uVar8 + (ulong)a[lVar7] * (ulong)uVar2;
    res[lVar7 + 3] = (uint32_t)uVar10;
    uVar8 = uVar10 >> 0x20;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  res[6] = (uint32_t)(uVar10 >> 0x20);
  uVar10 = (ulong)a[4];
  uVar9 = *a * uVar10 + (ulong)res[4];
  res[4] = (uint32_t)uVar9;
  uVar9 = a[1] * uVar10 + (ulong)res[5] + (uVar9 >> 0x20);
  res[5] = (uint32_t)uVar9;
  uVar11 = a[2] * uVar10 + uVar8 + (uVar9 >> 0x20);
  res[6] = (uint32_t)uVar11;
  uVar8 = a[3] * uVar10 + (ulong)res[7] + (uVar11 >> 0x20);
  *(ulong *)(res + 7) = uVar8;
  uVar10 = (ulong)a[5];
  uVar9 = *a * uVar10 + (uVar9 & 0xffffffff);
  res[5] = (uint32_t)uVar9;
  uVar9 = a[1] * uVar10 + (uVar9 >> 0x20) + (uVar11 & 0xffffffff);
  res[6] = (uint32_t)uVar9;
  uVar13 = a[2] * uVar10 + (uVar8 & 0xffffffff) + (uVar9 >> 0x20);
  res[7] = (uint32_t)uVar13;
  uVar11 = a[3] * uVar10 + (uVar8 >> 0x20) + (uVar13 >> 0x20);
  res[8] = (uint32_t)uVar11;
  uVar12 = a[4] * uVar10 + (ulong)res[9] + (uVar11 >> 0x20);
  *(ulong *)(res + 9) = uVar12;
  uVar8 = (ulong)a[6];
  uVar10 = *a * uVar8 + (uVar9 & 0xffffffff);
  res[6] = (uint32_t)uVar10;
  uVar10 = a[1] * uVar8 + (uVar10 >> 0x20) + (uVar13 & 0xffffffff);
  res[7] = (uint32_t)uVar10;
  uVar10 = a[2] * uVar8 + (uVar11 & 0xffffffff) + (uVar10 >> 0x20);
  res[8] = (uint32_t)uVar10;
  uVar10 = a[3] * uVar8 + (uVar12 & 0xffffffff) + (uVar10 >> 0x20);
  res[9] = (uint32_t)uVar10;
  lVar7 = 0;
  do {
    uVar10 = a[lVar7 + 4] * uVar8 + (ulong)res[lVar7 + 10] + (uVar10 >> 0x20);
    res[lVar7 + 10] = (uint32_t)uVar10;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 2);
  res[0xc] = (uint32_t)(uVar10 >> 0x20);
  uVar8 = (ulong)a[7];
  uVar10 = *a * uVar8 + (ulong)res[7];
  res[7] = (uint32_t)uVar10;
  uVar10 = a[1] * uVar8 + (ulong)res[8] + (uVar10 >> 0x20);
  res[8] = (uint32_t)uVar10;
  uVar10 = a[2] * uVar8 + (ulong)res[9] + (uVar10 >> 0x20);
  res[9] = (uint32_t)uVar10;
  uVar10 = a[3] * uVar8 + (ulong)res[10] + (uVar10 >> 0x20);
  res[10] = (uint32_t)uVar10;
  lVar7 = 0;
  do {
    uVar10 = a[lVar7 + 4] * uVar8 + (ulong)res[lVar7 + 0xb] + (uVar10 >> 0x20);
    res[lVar7 + 0xb] = (uint32_t)uVar10;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  res[0xe] = (uint32_t)(uVar10 >> 0x20);
  lVar7 = 0;
  bVar14 = false;
  do {
    uVar2 = *(uint *)((long)res + lVar7);
    uVar3 = *(uint *)((long)res + lVar7 + 4);
    *(uint *)((long)res + lVar7) = uVar2 * 2 + (uint)bVar14;
    uVar4 = (uint)(CARRY4(uVar2,uVar2) || CARRY4(uVar2 * 2,(uint)bVar14));
    *(uint *)((long)res + lVar7 + 4) = uVar3 * 2 + uVar4;
    uVar2 = *(uint *)((long)res + lVar7 + 8);
    uVar4 = (uint)(CARRY4(uVar3,uVar3) || CARRY4(uVar3 * 2,uVar4));
    *(uint *)((long)res + lVar7 + 8) = uVar2 * 2 + uVar4;
    uVar3 = *(uint *)((long)res + lVar7 + 0xc);
    uVar2 = (uint)(CARRY4(uVar2,uVar2) || CARRY4(uVar2 * 2,uVar4));
    bVar14 = CARRY4(uVar3,uVar3) || CARRY4(uVar3 * 2,uVar2);
    *(uint *)((long)res + lVar7 + 0xc) = uVar3 * 2 + uVar2;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x40);
  tmp._0_8_ = (ulong)*a * (ulong)*a;
  tmp._8_8_ = (ulong)a[1] * (ulong)a[1];
  tmp._16_8_ = (ulong)a[2] * (ulong)a[2];
  tmp._24_8_ = (ulong)a[3] * (ulong)a[3];
  tmp._32_8_ = (ulong)a[4] * (ulong)a[4];
  tmp._40_8_ = (ulong)a[5] * (ulong)a[5];
  tmp._48_8_ = (ulong)a[6] * (ulong)a[6];
  tmp._56_8_ = (ulong)a[7] * (ulong)a[7];
  lVar7 = 0xc;
  bVar14 = false;
  do {
    uVar3 = *(uint *)((long)auStack_54 + lVar7);
    puVar1 = (uint *)((long)res + lVar7 + -0xc);
    uVar2 = *puVar1;
    uVar5 = *puVar1 + uVar3;
    *puVar1 = uVar5 + bVar14;
    uVar4 = *(uint *)((long)auStack_54 + lVar7 + 4);
    puVar1 = (uint *)((long)res + lVar7 + -8);
    uVar5 = (uint)(CARRY4(uVar2,uVar3) || CARRY4(uVar5,(uint)bVar14));
    uVar2 = *puVar1;
    uVar6 = *puVar1 + uVar4;
    *puVar1 = uVar6 + uVar5;
    uVar3 = *(uint *)((long)auStack_54 + lVar7 + 8);
    puVar1 = (uint *)((long)res + lVar7 + -4);
    uVar4 = (uint)(CARRY4(uVar2,uVar4) || CARRY4(uVar6,uVar5));
    uVar2 = *puVar1;
    uVar5 = *puVar1 + uVar3;
    *puVar1 = uVar5 + uVar4;
    puVar1 = (uint *)((long)res + lVar7);
    uVar2 = (uint)(CARRY4(uVar2,uVar3) || CARRY4(uVar5,uVar4));
    uVar3 = *puVar1 + *(uint *)((long)tmp + lVar7);
    bVar14 = CARRY4(*puVar1,*(uint *)((long)tmp + lVar7)) || CARRY4(uVar3,uVar2);
    *puVar1 = uVar3 + uVar2;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x4c);
  return;
}

Assistant:

void Hacl_Bignum256_32_sqr(uint32_t *a, uint32_t *res)
{
  memset(res, 0U, 16U * sizeof (uint32_t));
  KRML_MAYBE_FOR8(i0,
    0U,
    8U,
    1U,
    uint32_t *ab = a;
    uint32_t a_j = a[i0];
    uint32_t *res_j = res + i0;
    uint32_t c = 0U;
    for (uint32_t i = 0U; i < i0 / 4U; i++)
    {
      uint32_t a_i = ab[4U * i];
      uint32_t *res_i0 = res_j + 4U * i;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, a_j, c, res_i0);
      uint32_t a_i0 = ab[4U * i + 1U];
      uint32_t *res_i1 = res_j + 4U * i + 1U;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i0, a_j, c, res_i1);
      uint32_t a_i1 = ab[4U * i + 2U];
      uint32_t *res_i2 = res_j + 4U * i + 2U;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i1, a_j, c, res_i2);
      uint32_t a_i2 = ab[4U * i + 3U];
      uint32_t *res_i = res_j + 4U * i + 3U;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i2, a_j, c, res_i);
    }
    for (uint32_t i = i0 / 4U * 4U; i < i0; i++)
    {
      uint32_t a_i = ab[i];
      uint32_t *res_i = res_j + i;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, a_j, c, res_i);
    }
    uint32_t r = c;
    res[i0 + i0] = r;);
  uint32_t c0 = Hacl_Bignum_Addition_bn_add_eq_len_u32(16U, res, res, res);
  KRML_MAYBE_UNUSED_VAR(c0);
  uint32_t tmp[16U] = { 0U };
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint64_t res1 = (uint64_t)a[i] * (uint64_t)a[i];
    uint32_t hi = (uint32_t)(res1 >> 32U);
    uint32_t lo = (uint32_t)res1;
    tmp[2U * i] = lo;
    tmp[2U * i + 1U] = hi;);
  uint32_t c1 = Hacl_Bignum_Addition_bn_add_eq_len_u32(16U, res, tmp, res);
  KRML_MAYBE_UNUSED_VAR(c1);
}